

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_table_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int64_t iVar1;
  int *piVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  uint uVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  int64_t *ptr;
  undefined1 (*ptr_00) [16];
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  int iVar49;
  ulong uVar50;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  uint uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  bool bVar59;
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  ulong uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  long local_628;
  long local_620;
  long local_608;
  long local_600;
  undefined1 local_5c0 [32];
  undefined1 local_580 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  long local_480 [4];
  long local_460 [4];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  long local_3e0 [4];
  long local_3c0;
  long lStack_3b8;
  long lStack_3b0;
  long lStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  long local_300 [4];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  long local_1c0;
  long lStack_1b8;
  long lStack_1b0;
  long lStack_1a8;
  undefined1 local_1a0 [32];
  ulong local_180;
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  ulong local_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  long lVar51;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_table_diag_avx2_256_64_cold_8();
  }
  else {
    local_400._4_4_ = 0;
    local_400._0_4_ = s2Len;
    if (s2Len < 1) {
      parasail_sw_stats_table_diag_avx2_256_64_cold_7();
    }
    else if (open < 0) {
      parasail_sw_stats_table_diag_avx2_256_64_cold_6();
    }
    else if (gap < 0) {
      parasail_sw_stats_table_diag_avx2_256_64_cold_5();
    }
    else {
      uVar32 = (ulong)(uint)_s1Len;
      if (matrix == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_table_diag_avx2_256_64_cold_4();
      }
      else {
        if (matrix->type == 1) {
          if (_s1 == (char *)0x0) {
            parasail_sw_stats_table_diag_avx2_256_64_cold_3();
            return (parasail_result_t *)0x0;
          }
        }
        else {
          if (_s1 == (char *)0x0) {
            parasail_sw_stats_table_diag_avx2_256_64_cold_2();
            return (parasail_result_t *)0x0;
          }
          if (_s1Len < 1) {
            parasail_sw_stats_table_diag_avx2_256_64_cold_1();
            return (parasail_result_t *)0x0;
          }
        }
        if (matrix->type != 0) {
          uVar32 = (ulong)(uint)matrix->length;
        }
        iVar36 = matrix->min;
        uVar33 = (ulong)(uint)open;
        uVar27 = 0x8000000000000000 - (long)iVar36;
        if (iVar36 != -open && SBORROW4(iVar36,-open) == iVar36 + open < 0) {
          uVar27 = uVar33 | 0x8000000000000000;
        }
        lVar26 = uVar27 + 1;
        iVar36 = matrix->max;
        local_4a0._8_8_ = lVar26;
        local_4a0._0_8_ = lVar26;
        local_4a0._16_8_ = lVar26;
        local_4a0._24_8_ = lVar26;
        local_4c0._8_8_ = lVar26;
        local_4c0._0_8_ = lVar26;
        local_4c0._16_8_ = lVar26;
        local_4c0._24_8_ = lVar26;
        uVar15 = (uint)uVar32;
        local_480[0] = lVar26;
        local_480[1] = lVar26;
        local_480[2] = lVar26;
        local_480[3] = lVar26;
        local_460[0] = lVar26;
        local_460[1] = lVar26;
        local_460[2] = lVar26;
        local_460[3] = lVar26;
        local_3e0[0] = lVar26;
        local_3e0[1] = lVar26;
        local_3e0[2] = lVar26;
        local_3e0[3] = lVar26;
        local_300[0] = lVar26;
        local_300[1] = lVar26;
        local_300[2] = lVar26;
        local_300[3] = lVar26;
        ppVar17 = parasail_result_new_table3(uVar15,s2Len);
        if (ppVar17 != (parasail_result_t *)0x0) {
          iVar21 = uVar15 + 3;
          ppVar17->flag = ppVar17->flag | 0x4831004;
          ptr = parasail_memalign_int64_t(0x20,(long)iVar21);
          uVar27 = (ulong)(s2Len + 6);
          ptr_00 = (undefined1 (*) [16])parasail_memalign_int64_t(0x20,uVar27);
          ptr_01 = parasail_memalign_int64_t(0x20,uVar27);
          ptr_02 = parasail_memalign_int64_t(0x20,uVar27);
          ptr_03 = parasail_memalign_int64_t(0x20,uVar27);
          ptr_04 = parasail_memalign_int64_t(0x20,uVar27);
          ptr_05 = parasail_memalign_int64_t(0x20,uVar27);
          ptr_06 = parasail_memalign_int64_t(0x20,uVar27);
          ptr_07 = parasail_memalign_int64_t(0x20,uVar27);
          ptr_08 = parasail_memalign_int64_t(0x20,uVar27);
          if ((ptr_08 != (int64_t *)0x0 &&
              (ptr_07 != (int64_t *)0x0 && (ptr_06 != (int64_t *)0x0 && ptr_05 != (int64_t *)0x0)))
              && ((ptr_04 != (int64_t *)0x0 &&
                  (ptr_03 != (int64_t *)0x0 && ptr_02 != (int64_t *)0x0)) &&
                 ((ptr_01 != (int64_t *)0x0 && ptr_00 != (undefined1 (*) [16])0x0) &&
                 ptr != (int64_t *)0x0))) {
            local_3c0 = 0x7ffffffffffffffe - (long)iVar36;
            local_2c0._4_4_ = 0;
            local_2c0._0_4_ = gap;
            local_1c0 = (long)(int)uVar15;
            uVar14 = local_400._0_8_;
            uVar55 = local_400._0_4_;
            uVar27 = local_400._0_8_ & 0xffffffff;
            if (0 < (int)uVar15) {
              piVar2 = matrix->mapper;
              uVar28 = 0;
              do {
                ptr[uVar28] = (long)piVar2[(byte)_s1[uVar28]];
                uVar28 = uVar28 + 1;
              } while (uVar32 != uVar28);
            }
            uVar22 = uVar55 + 3;
            auVar7._8_8_ = lVar26;
            auVar7._0_8_ = lVar26;
            auVar7._16_8_ = lVar26;
            auVar7._24_8_ = lVar26;
            local_1a0 = vblendpd_avx(ZEXT832(0) << 0x40,auVar7,7);
            local_2c0._8_4_ = gap;
            local_2c0._12_4_ = 0;
            local_2c0._16_4_ = gap;
            local_2c0._20_4_ = 0;
            local_2c0._24_4_ = gap;
            local_2c0._28_4_ = 0;
            iVar36 = uVar15 + 1;
            if ((int)(uVar15 + 1) < iVar21) {
              iVar36 = iVar21;
            }
            uVar28 = 0;
            lStack_3b8 = local_3c0;
            lStack_3b0 = local_3c0;
            lStack_3a8 = local_3c0;
            lStack_1b8 = local_1c0;
            lStack_1b0 = local_1c0;
            lStack_1a8 = local_1c0;
            local_180 = uVar27;
            uStack_178 = uVar27;
            uStack_170 = uVar27;
            uStack_168 = uVar27;
            local_160 = uVar33;
            uStack_158 = uVar33;
            uStack_150 = uVar33;
            uStack_148 = uVar33;
            memset(ptr + local_1c0,0,(ulong)(~uVar15 + iVar36) * 8 + 8);
            piVar2 = matrix->mapper;
            uVar33 = 1;
            if (1 < (int)uVar55) {
              uVar33 = uVar14 & 0xffffffff;
            }
            do {
              *(long *)(ptr_00[1] + uVar28 * 8 + 8) = (long)piVar2[(byte)_s2[uVar28]];
              uVar28 = uVar28 + 1;
            } while (uVar33 != uVar28);
            *ptr_00 = (undefined1  [16])0x0;
            *(undefined8 *)ptr_00[1] = 0;
            uVar11 = uVar55 + 1;
            if ((int)(uVar55 + 1) < (int)uVar22) {
              uVar11 = uVar22;
            }
            memset(ptr_00[1] + uVar27 * 8 + 8,0,(ulong)(~uVar55 + uVar11) * 8 + 8);
            lVar18 = 0;
            do {
              *(undefined8 *)((long)ptr_01 + lVar18 + 0x18) = 0;
              *(undefined8 *)((long)ptr_02 + lVar18 + 0x18) = 0;
              *(undefined8 *)((long)ptr_03 + lVar18 + 0x18) = 0;
              *(undefined8 *)((long)ptr_04 + lVar18 + 0x18) = 0;
              *(long *)((long)ptr_05 + lVar18 + 0x18) = lVar26;
              *(undefined8 *)((long)ptr_06 + lVar18 + 0x18) = 0;
              *(undefined8 *)((long)ptr_07 + lVar18 + 0x18) = 0;
              *(undefined8 *)((long)ptr_08 + lVar18 + 0x18) = 0;
              lVar18 = lVar18 + 8;
            } while (uVar33 * 8 != lVar18);
            lVar18 = 0;
            do {
              *(long *)((long)ptr_01 + lVar18) = lVar26;
              *(undefined8 *)((long)ptr_02 + lVar18) = 0;
              *(undefined8 *)((long)ptr_03 + lVar18) = 0;
              *(undefined8 *)((long)ptr_04 + lVar18) = 0;
              *(long *)((long)ptr_05 + lVar18) = lVar26;
              *(undefined8 *)((long)ptr_06 + lVar18) = 0;
              *(undefined8 *)((long)ptr_07 + lVar18) = 0;
              *(undefined8 *)((long)ptr_08 + lVar18) = 0;
              lVar18 = lVar18 + 8;
            } while (lVar18 != 0x18);
            lVar18 = 0;
            do {
              ptr_01[uVar27 + lVar18 + 3] = lVar26;
              ptr_02[uVar27 + lVar18 + 3] = 0;
              ptr_03[uVar27 + lVar18 + 3] = 0;
              ptr_04[uVar27 + lVar18 + 3] = 0;
              ptr_05[uVar27 + lVar18 + 3] = lVar26;
              ptr_06[uVar27 + lVar18 + 3] = 0;
              ptr_07[uVar27 + lVar18 + 3] = 0;
              ptr_08[uVar27 + lVar18 + 3] = 0;
              lVar18 = lVar18 + 1;
            } while ((int)(uVar55 + (int)lVar18) < (int)uVar22);
            ptr_01[2] = 0;
            local_380._8_8_ = local_300[1];
            local_380._0_8_ = local_300[0];
            local_380._16_8_ = local_300[2];
            local_380._24_8_ = local_300[3];
            local_360._8_8_ = local_3e0[1];
            local_360._0_8_ = local_3e0[0];
            local_360._16_8_ = local_3e0[2];
            local_360._24_8_ = local_3e0[3];
            local_340._8_8_ = local_460[1];
            local_340._0_8_ = local_460[0];
            local_340._16_8_ = local_460[2];
            local_340._24_8_ = local_460[3];
            local_320._8_8_ = local_480[1];
            local_320._0_8_ = local_480[0];
            local_320._16_8_ = local_480[2];
            local_320._24_8_ = local_480[3];
            auVar98 = ZEXT3264(local_4a0);
            auVar94 = ZEXT3264(local_4c0);
            if ((int)uVar15 < 1) {
              local_440._8_8_ = lStack_3b8;
              local_440._0_8_ = local_3c0;
              local_440._16_8_ = lStack_3b0;
              local_440._24_8_ = lStack_3a8;
              local_420._8_8_ = lVar26;
              local_420._0_8_ = lVar26;
              local_420._16_8_ = lVar26;
              local_420._24_8_ = lVar26;
            }
            else {
              piVar2 = matrix->matrix;
              uVar15 = uVar15 - 1;
              uVar33 = 1;
              if (1 < (int)uVar22) {
                uVar33 = (ulong)uVar22;
              }
              lVar18 = uVar27 * 0x10;
              local_600 = uVar27 * 4 + -4;
              local_620 = uVar27 * 0xc + -0xc;
              local_628 = uVar27 * 8 + -8;
              auVar7 = vpmovsxbq_avx2(ZEXT416(0x10203));
              local_608 = 0;
              local_1e0 = 4;
              uStack_1d8 = 4;
              uStack_1d0 = 4;
              uStack_1c8 = 4;
              uVar28 = 0;
              local_420._8_8_ = lVar26;
              local_420._0_8_ = lVar26;
              local_420._16_8_ = lVar26;
              local_420._24_8_ = lVar26;
              local_440._8_8_ = lStack_3b8;
              local_440._0_8_ = local_3c0;
              local_440._16_8_ = lStack_3b0;
              local_440._24_8_ = lStack_3a8;
              do {
                uVar40 = uVar28 | 2;
                uVar29 = uVar28 | 3;
                iVar36 = matrix->type;
                uVar55 = (uint)uVar28;
                uVar22 = uVar15;
                if (uVar29 < uVar32) {
                  uVar22 = uVar55 | 3;
                }
                uVar19 = (long)(int)uVar22;
                if (iVar36 == 0) {
                  uVar19 = ptr[uVar28 + 3];
                }
                uVar22 = uVar55 | 2;
                if (uVar32 <= uVar40) {
                  uVar22 = uVar15;
                }
                uVar24 = (long)(int)uVar22;
                if (iVar36 == 0) {
                  uVar24 = ptr[uVar28 + 2];
                }
                uVar55 = uVar55 | 1;
                if (uVar32 <= (uVar28 | 1)) {
                  uVar55 = uVar15;
                }
                auVar70._8_8_ = 0;
                auVar70._0_8_ = ptr[uVar28];
                auVar73._8_8_ = 0;
                auVar73._0_8_ = ptr[uVar28 + 1];
                auVar70 = vpunpcklqdq_avx(auVar73,auVar70);
                auVar61._8_8_ = 0;
                auVar61._0_8_ = ptr[uVar28 + 2];
                auVar64._8_8_ = 0;
                auVar64._0_8_ = ptr[uVar28 + 3];
                auVar61 = vpunpcklqdq_avx(auVar64,auVar61);
                local_120._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar61;
                local_120._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70;
                auVar6 = local_120;
                uVar41 = (long)(int)uVar55;
                if (iVar36 == 0) {
                  uVar41 = ptr[uVar28 + 1];
                }
                lVar30 = (long)matrix->size;
                uVar37 = ptr[uVar28];
                if (iVar36 != 0) {
                  uVar37 = uVar28;
                }
                auVar5._8_8_ = lStack_1b8;
                auVar5._0_8_ = local_1c0;
                auVar5._16_8_ = lStack_1b0;
                auVar5._24_8_ = lStack_1a8;
                local_2e0 = auVar7;
                local_140 = vpcmpgtq_avx2(auVar5,auVar7);
                uVar25 = 0;
                auVar4._8_8_ = lVar26;
                auVar4._0_8_ = lVar26;
                auVar4._16_8_ = lVar26;
                auVar4._24_8_ = lVar26;
                auVar63 = ZEXT1664((undefined1  [16])0x0);
                local_580 = auVar63._0_32_;
                local_5c0._0_8_ = 0;
                local_5c0._8_8_ = 0;
                local_5c0._16_8_ = 0;
                local_5c0._24_8_ = 0;
                auVar115 = ZEXT864(0) << 0x40;
                auVar110 = ZEXT864(0) << 0x40;
                auVar111 = ZEXT864(0) << 0x40;
                auVar113 = ZEXT864(0) << 0x40;
                auVar101 = ZEXT864(0) << 0x40;
                local_240 = ZEXT1632(ZEXT816(0));
                local_260 = ZEXT1632(ZEXT816(0));
                local_2a0 = ZEXT1632(ZEXT816(0));
                auVar5 = local_1a0;
                auVar82 = local_1a0;
                local_4e0 = local_580;
                local_280 = auVar4;
                local_220 = auVar4;
                auVar10 = _DAT_008d4980;
                do {
                  auVar8 = local_240;
                  local_c0 = auVar10;
                  local_a0 = auVar98._0_32_;
                  local_80 = auVar94._0_32_;
                  auVar86 = vpsubq_avx2(auVar4,local_2c0);
                  auVar9._8_8_ = uStack_158;
                  auVar9._0_8_ = local_160;
                  auVar9._16_8_ = uStack_150;
                  auVar9._24_8_ = uStack_148;
                  auVar62 = vpsubq_avx2(auVar82,auVar9);
                  auVar4 = vpcmpgtq_avx2(auVar62,auVar86);
                  local_200 = vblendvpd_avx(auVar110._0_32_,auVar101._0_32_,auVar4);
                  auVar82 = vpermq_avx2(auVar82,0xf9);
                  local_400 = vblendvpd_avx(auVar115._0_32_,auVar113._0_32_,auVar4);
                  iVar1 = ptr_01[uVar25 + 3];
                  auVar104._8_8_ = iVar1;
                  auVar104._0_8_ = iVar1;
                  auVar104._16_8_ = iVar1;
                  auVar104._24_8_ = iVar1;
                  local_e0 = vpblendd_avx2(auVar82,auVar104,0xc0);
                  auVar104 = vblendvpd_avx(auVar63._0_32_,auVar111._0_32_,auVar4);
                  auVar4 = vpermq_avx2(local_220,0xf9);
                  lVar51 = *(long *)(ptr_00[1] + uVar25 * 8 + 8);
                  auVar82._8_8_ = lVar51;
                  auVar82._0_8_ = lVar51;
                  auVar82._16_8_ = lVar51;
                  auVar82._24_8_ = lVar51;
                  local_220 = vpblendd_avx2(auVar4,auVar82,0xc0);
                  auVar83._0_8_ = -(ulong)(local_220._0_8_ == local_120._0_8_);
                  auVar83._8_8_ = -(ulong)(local_220._8_8_ == local_120._8_8_);
                  auVar83._16_8_ = -(ulong)(local_220._16_8_ == local_120._16_8_);
                  auVar83._24_8_ = -(ulong)(local_220._24_8_ == local_120._24_8_);
                  auVar69 = vpsubq_avx2(local_2a0,auVar83);
                  auVar4 = vpermpd_avx2(auVar101._0_32_,0xf9);
                  iVar1 = ptr_02[uVar25 + 3];
                  auVar105._8_8_ = iVar1;
                  auVar105._0_8_ = iVar1;
                  auVar105._16_8_ = iVar1;
                  auVar105._24_8_ = iVar1;
                  local_2a0 = vblendpd_avx(auVar4,auVar105,8);
                  auVar74._8_8_ = 0;
                  auVar74._0_8_ = (long)piVar2[uVar37 * lVar30 + lVar51];
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = (long)piVar2[uVar41 * lVar30 + *(long *)(ptr_00[1] + uVar25 * 8)]
                  ;
                  auVar70 = vpunpcklqdq_avx(auVar102,auVar74);
                  auVar103._8_8_ = 0;
                  auVar103._0_8_ =
                       (long)piVar2[uVar24 * lVar30 + *(long *)(*ptr_00 + uVar25 * 8 + 8)];
                  auVar106._8_8_ = 0;
                  auVar106._0_8_ = (long)piVar2[uVar19 * lVar30 + *(long *)(*ptr_00 + uVar25 * 8)];
                  auVar61 = vpunpcklqdq_avx(auVar106,auVar103);
                  auVar84._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar61;
                  auVar84._16_16_ = ZEXT116(1) * auVar70;
                  auVar83 = vpaddq_avx2(auVar84,auVar5);
                  auVar5 = vpcmpgtq_avx2(auVar84,ZEXT832(0) << 0x40);
                  local_100 = vpsubq_avx2(local_260,auVar5);
                  auVar5 = vpermpd_avx2(auVar113._0_32_,0xf9);
                  iVar1 = ptr_03[uVar25 + 3];
                  auVar107._8_8_ = iVar1;
                  auVar107._0_8_ = iVar1;
                  auVar107._16_8_ = iVar1;
                  auVar107._24_8_ = iVar1;
                  local_260 = vblendpd_avx(auVar5,auVar107,8);
                  auVar5 = vpermpd_avx2(auVar111._0_32_,0xf9);
                  iVar1 = ptr_04[uVar25 + 3];
                  auVar99._8_8_ = iVar1;
                  auVar99._0_8_ = iVar1;
                  auVar99._16_8_ = iVar1;
                  auVar99._24_8_ = iVar1;
                  local_240 = vblendpd_avx(auVar5,auVar99,8);
                  auVar5 = vpermq_avx2(local_280,0xf9);
                  iVar1 = ptr_05[uVar25 + 3];
                  auVar100._8_8_ = iVar1;
                  auVar100._0_8_ = iVar1;
                  auVar100._16_8_ = iVar1;
                  auVar100._24_8_ = iVar1;
                  auVar84 = vpblendd_avx2(auVar5,auVar100,0xc0);
                  auVar5 = vpermpd_avx2(local_4e0,0xf9);
                  iVar1 = ptr_06[uVar25 + 3];
                  auVar108._8_8_ = iVar1;
                  auVar108._0_8_ = iVar1;
                  auVar108._16_8_ = iVar1;
                  auVar108._24_8_ = iVar1;
                  auVar5 = vblendpd_avx(auVar5,auVar108,8);
                  auVar4 = vpermpd_avx2(local_5c0,0xf9);
                  iVar1 = ptr_07[uVar25 + 3];
                  auVar112._8_8_ = iVar1;
                  auVar112._0_8_ = iVar1;
                  auVar112._16_8_ = iVar1;
                  auVar112._24_8_ = iVar1;
                  auVar4 = vblendpd_avx(auVar4,auVar112,8);
                  auVar82 = vpermpd_avx2(local_580,0xf9);
                  iVar1 = ptr_08[uVar25 + 3];
                  auVar114._8_8_ = iVar1;
                  auVar114._0_8_ = iVar1;
                  auVar114._16_8_ = iVar1;
                  auVar114._24_8_ = iVar1;
                  auVar82 = vblendpd_avx(auVar82,auVar114,8);
                  auVar9 = vpsubq_avx2(local_e0,auVar9);
                  uVar20 = vpextrq_avx(auVar9._16_16_,1);
                  auVar99 = vpsubq_avx2(auVar84,local_2c0);
                  uVar52 = vpextrq_avx(auVar9._0_16_,1);
                  uVar48 = vpextrq_avx(auVar99._0_16_,1);
                  auVar84 = vpcmpgtq_avx2(auVar9,auVar99);
                  uVar38 = vpextrq_avx(auVar99._16_16_,1);
                  local_4e0 = vblendvpd_avx(auVar5,local_2a0,auVar84);
                  auVar5 = vblendvpd_avx(auVar4,local_260,auVar84);
                  auVar4 = vblendvpd_avx(auVar82,local_240,auVar84);
                  uVar44 = auVar99._0_8_;
                  if ((long)auVar99._0_8_ < (long)auVar9._0_8_) {
                    uVar44 = auVar9._0_8_;
                  }
                  uVar34 = vpextrq_avx(auVar62._0_16_,1);
                  uVar57 = vpextrq_avx(auVar62._16_16_,1);
                  if ((long)uVar48 < (long)uVar52) {
                    uVar48 = uVar52;
                  }
                  uVar52 = auVar99._16_8_;
                  if ((long)auVar99._16_8_ < (long)auVar9._16_8_) {
                    uVar52 = auVar9._16_8_;
                  }
                  if ((long)uVar38 < (long)uVar20) {
                    uVar38 = uVar20;
                  }
                  uVar20 = auVar86._0_8_;
                  if ((long)auVar86._0_8_ < (long)auVar62._0_8_) {
                    uVar20 = auVar62._0_8_;
                  }
                  uVar42 = vpextrq_avx(auVar86._0_16_,1);
                  uVar56 = vpextrq_avx(auVar86._16_16_,1);
                  if ((long)uVar42 < (long)uVar34) {
                    uVar42 = uVar34;
                  }
                  uVar34 = auVar86._16_8_;
                  if ((long)auVar86._16_8_ < (long)auVar62._16_8_) {
                    uVar34 = auVar62._16_8_;
                  }
                  if ((long)uVar56 < (long)uVar57) {
                    uVar56 = uVar57;
                  }
                  uVar95 = auVar83._0_8_;
                  uVar57 = uVar95;
                  if ((long)uVar95 <= (long)uVar20) {
                    uVar57 = uVar20;
                  }
                  uVar35 = vpextrq_avx(auVar83._0_16_,1);
                  if ((long)uVar35 <= (long)uVar42) {
                    uVar35 = uVar42;
                  }
                  auVar65._8_8_ = 0;
                  auVar65._0_8_ = uVar38;
                  auVar75._8_8_ = 0;
                  auVar75._0_8_ = uVar52;
                  auVar70 = vpunpcklqdq_avx(auVar75,auVar65);
                  uVar58 = vpextrq_avx(auVar83._16_16_,1);
                  uVar47 = auVar83._16_8_;
                  uVar50 = uVar47;
                  if ((long)uVar47 <= (long)uVar34) {
                    uVar50 = uVar34;
                  }
                  if ((long)uVar58 <= (long)uVar56) {
                    uVar58 = uVar56;
                  }
                  if ((long)uVar57 <= (long)uVar44) {
                    uVar57 = uVar44;
                  }
                  auVar76._8_8_ = 0;
                  auVar76._0_8_ = uVar48;
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = uVar44;
                  auVar61 = vpunpcklqdq_avx(auVar87,auVar76);
                  if ((long)uVar35 <= (long)uVar48) {
                    uVar35 = uVar48;
                  }
                  local_280._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar61;
                  auVar70 = ZEXT116(1) * auVar70;
                  local_280._16_16_ = auVar70;
                  if ((long)uVar50 <= (long)uVar52) {
                    uVar50 = uVar52;
                  }
                  if ((long)uVar58 <= (long)uVar38) {
                    uVar58 = uVar38;
                  }
                  auVar66._8_8_ = 0;
                  auVar66._0_8_ = ~((long)uVar58 >> 0x3f) & uVar58;
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = ~((long)uVar50 >> 0x3f) & uVar50;
                  auVar61 = vpunpcklqdq_avx(auVar77,auVar66);
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = ~((long)uVar35 >> 0x3f) & uVar35;
                  auVar88._8_8_ = 0;
                  auVar88._0_8_ = ~((long)uVar57 >> 0x3f) & uVar57;
                  auVar64 = vpunpcklqdq_avx(auVar88,auVar78);
                  auVar109._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar64;
                  auVar61 = ZEXT116(1) * auVar61;
                  auVar109._16_16_ = auVar61;
                  uVar38 = auVar109._0_8_;
                  auVar68._0_8_ = -(ulong)(uVar38 == uVar95);
                  lVar51 = auVar109._8_8_;
                  auVar68._8_8_ = -(ulong)(lVar51 == auVar83._8_8_);
                  uVar48 = auVar61._0_8_;
                  auVar68._16_8_ = -(ulong)(uVar48 == uVar47);
                  lVar31 = auVar61._8_8_;
                  auVar68._24_8_ = -(ulong)(lVar31 == auVar83._24_8_);
                  auVar85._0_8_ = -(ulong)(uVar38 == local_280._0_8_);
                  auVar85._8_8_ = -(ulong)(lVar51 == local_280._8_8_);
                  auVar85._16_8_ = -(ulong)(uVar48 == auVar70._0_8_);
                  auVar85._24_8_ = -(ulong)(lVar31 == auVar70._8_8_);
                  auVar82 = vblendvpd_avx(local_200,local_4e0,auVar85);
                  auVar82 = vblendvpd_avx(auVar82,auVar69,auVar68);
                  auVar83 = vblendvpd_avx(local_400,auVar5,auVar85);
                  auVar83 = vblendvpd_avx(auVar83,local_100,auVar68);
                  auVar84 = vpcmpeqd_avx2(local_2a0,local_2a0);
                  auVar86 = vpsubq_avx2(auVar8,auVar84);
                  local_580 = vpsubq_avx2(auVar4,auVar84);
                  local_3a0 = vpsubq_avx2(auVar104,auVar84);
                  auVar4 = vblendvpd_avx(local_3a0,local_580,auVar85);
                  auVar4 = vblendvpd_avx(auVar4,auVar86,auVar68);
                  auVar86._0_8_ = -(ulong)(uVar38 == 0);
                  auVar86._8_8_ = -(ulong)(lVar51 == 0);
                  auVar86._16_8_ = -(ulong)(uVar48 == 0);
                  auVar86._24_8_ = -(ulong)(lVar31 == 0);
                  auVar62._0_8_ = -(ulong)(auVar10._0_8_ == auVar84._0_8_);
                  auVar62._8_8_ = -(ulong)(auVar10._8_8_ == auVar84._8_8_);
                  auVar62._16_8_ = -(ulong)(auVar10._16_8_ == auVar84._16_8_);
                  auVar62._24_8_ = -(ulong)(auVar10._24_8_ == auVar84._24_8_);
                  auVar86 = vpor_avx2(auVar62,auVar86);
                  auVar104 = vpandn_avx2(auVar86,auVar82);
                  auVar101 = ZEXT3264(auVar104);
                  auVar83 = vpandn_avx2(auVar86,auVar83);
                  auVar4 = vpandn_avx2(auVar86,auVar4);
                  auVar111 = ZEXT3264(auVar4);
                  auVar82 = vpandn_avx2(auVar62,auVar109);
                  uVar52 = auVar82._0_8_;
                  uVar48 = auVar104._0_8_;
                  uVar95 = auVar4._0_8_;
                  uVar38 = auVar83._0_8_;
                  uVar57 = auVar82._16_8_;
                  if (3 < uVar25) {
                    uVar35 = local_440._0_8_;
                    if ((long)uVar52 <= (long)local_440._0_8_) {
                      uVar35 = uVar52;
                    }
                    uVar50 = vpextrq_avx(local_440._0_16_,1);
                    uVar58 = vpextrq_avx(auVar82._0_16_,1);
                    if ((long)uVar58 <= (long)uVar50) {
                      uVar50 = uVar58;
                    }
                    uVar47 = local_440._16_8_;
                    if ((long)uVar57 <= (long)local_440._16_8_) {
                      uVar47 = uVar57;
                    }
                    uVar54 = vpextrq_avx(local_440._16_16_,1);
                    uVar53 = vpextrq_avx(auVar82._16_16_,1);
                    if ((long)uVar53 <= (long)uVar54) {
                      uVar54 = uVar53;
                    }
                    uVar39 = uVar52;
                    if ((long)uVar52 < (long)local_420._0_8_) {
                      uVar39 = local_420._0_8_;
                    }
                    uVar45 = vpextrq_avx(local_420._0_16_,1);
                    if ((long)uVar58 < (long)uVar45) {
                      uVar58 = uVar45;
                    }
                    uVar45 = uVar57;
                    if ((long)uVar57 < (long)local_420._16_8_) {
                      uVar45 = local_420._16_8_;
                    }
                    uVar46 = vpextrq_avx(local_420._16_16_,1);
                    if ((long)uVar53 < (long)uVar46) {
                      uVar53 = uVar46;
                    }
                    if ((long)uVar39 <= (long)uVar48) {
                      uVar39 = uVar48;
                    }
                    uVar46 = vpextrq_avx(auVar104._0_16_,1);
                    if ((long)uVar58 <= (long)uVar46) {
                      uVar58 = uVar46;
                    }
                    if ((long)uVar45 <= (long)auVar104._16_8_) {
                      uVar45 = auVar104._16_8_;
                    }
                    uVar46 = vpextrq_avx(auVar104._16_16_,1);
                    if ((long)uVar53 <= (long)uVar46) {
                      uVar53 = uVar46;
                    }
                    if ((long)uVar39 <= (long)uVar38) {
                      uVar39 = uVar38;
                    }
                    auVar79._8_8_ = 0;
                    auVar79._0_8_ = uVar54;
                    auVar89._8_8_ = 0;
                    auVar89._0_8_ = uVar47;
                    auVar70 = vpunpcklqdq_avx(auVar89,auVar79);
                    uVar47 = vpextrq_avx(auVar83._0_16_,1);
                    if ((long)uVar58 <= (long)uVar47) {
                      uVar58 = uVar47;
                    }
                    if ((long)uVar45 <= (long)auVar83._16_8_) {
                      uVar45 = auVar83._16_8_;
                    }
                    uVar47 = vpextrq_avx(auVar83._16_16_,1);
                    if ((long)uVar53 <= (long)uVar47) {
                      uVar53 = uVar47;
                    }
                    if ((long)uVar39 <= (long)uVar95) {
                      uVar39 = uVar95;
                    }
                    uVar47 = vpextrq_avx(auVar4._0_16_,1);
                    if ((long)uVar58 <= (long)uVar47) {
                      uVar58 = uVar47;
                    }
                    if ((long)uVar45 <= (long)auVar4._16_8_) {
                      uVar45 = auVar4._16_8_;
                    }
                    uVar47 = vpextrq_avx(auVar4._16_16_,1);
                    auVar90._8_8_ = 0;
                    auVar90._0_8_ = uVar50;
                    auVar96._8_8_ = 0;
                    auVar96._0_8_ = uVar35;
                    auVar61 = vpunpcklqdq_avx(auVar96,auVar90);
                    if ((long)uVar53 <= (long)uVar47) {
                      uVar53 = uVar47;
                    }
                    local_440._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar61;
                    local_440._16_16_ = ZEXT116(1) * auVar70;
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = uVar53;
                    auVar91._8_8_ = 0;
                    auVar91._0_8_ = uVar45;
                    auVar70 = vpunpcklqdq_avx(auVar91,auVar80);
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = uVar58;
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = uVar39;
                    auVar61 = vpunpcklqdq_avx(auVar97,auVar92);
                    local_420._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar61;
                    local_420._16_16_ = ZEXT116(1) * auVar70;
                  }
                  auVar113 = ZEXT3264(auVar83);
                  lVar51 = *((ppVar17->field_4).trace)->trace_del_table;
                  if (uVar25 < uVar27) {
                    *(int *)(local_608 + lVar51 + uVar25 * 4) = auVar82._24_4_;
                  }
                  bVar59 = (uVar28 | 1) < uVar32;
                  bVar60 = uVar25 - 1 < uVar27;
                  if (bVar60 && bVar59) {
                    *(int *)(local_600 + lVar51 + uVar25 * 4) = auVar82._16_4_;
                  }
                  if ((uVar40 < uVar32) && ((long)(uVar25 - 2) < (long)uVar27 && 1 < uVar25)) {
                    *(int *)(local_628 + lVar51 + uVar25 * 4) = auVar82._8_4_;
                  }
                  lVar31 = uVar25 - 3;
                  if ((uVar29 < uVar32) && (lVar31 < (long)uVar27 && 2 < uVar25)) {
                    *(int *)(lVar51 + local_620 + uVar25 * 4) = auVar82._0_4_;
                  }
                  lVar51 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 8);
                  if (uVar25 < uVar27) {
                    *(int *)(local_608 + lVar51 + uVar25 * 4) = auVar104._24_4_;
                  }
                  if (bVar60 && bVar59) {
                    *(int *)(local_600 + lVar51 + uVar25 * 4) = auVar104._16_4_;
                  }
                  if ((uVar40 < uVar32) && ((long)(uVar25 - 2) < (long)uVar27 && 1 < uVar25)) {
                    *(int *)(local_628 + lVar51 + uVar25 * 4) = auVar104._8_4_;
                  }
                  if ((uVar29 < uVar32) && (lVar31 < (long)uVar27 && 2 < uVar25)) {
                    *(int *)(lVar51 + local_620 + uVar25 * 4) = auVar104._0_4_;
                  }
                  lVar51 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x10);
                  if (uVar25 < uVar27) {
                    *(int *)(local_608 + lVar51 + uVar25 * 4) = auVar83._24_4_;
                  }
                  if (bVar60 && bVar59) {
                    *(int *)(local_600 + lVar51 + uVar25 * 4) = auVar83._16_4_;
                  }
                  if ((uVar40 < uVar32) && ((long)(uVar25 - 2) < (long)uVar27 && 1 < uVar25)) {
                    *(int *)(local_628 + lVar51 + uVar25 * 4) = auVar83._8_4_;
                  }
                  if ((uVar29 < uVar32) && (lVar31 < (long)uVar27 && 2 < uVar25)) {
                    *(int *)(lVar51 + local_620 + uVar25 * 4) = auVar83._0_4_;
                  }
                  lVar51 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x18);
                  if (uVar25 < uVar27) {
                    *(int *)(local_608 + lVar51 + uVar25 * 4) = auVar4._24_4_;
                  }
                  if (bVar60 && bVar59) {
                    *(int *)(local_600 + lVar51 + uVar25 * 4) = auVar4._16_4_;
                  }
                  if ((uVar40 < uVar32) && ((long)(uVar25 - 2) < (long)uVar27 && 1 < uVar25)) {
                    *(int *)(local_628 + lVar51 + uVar25 * 4) = auVar4._8_4_;
                  }
                  auVar67._8_8_ = 0;
                  auVar67._0_8_ = uVar56;
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = uVar34;
                  auVar70 = vpunpcklqdq_avx(auVar71,auVar67);
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar42;
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = uVar20;
                  auVar61 = vpunpcklqdq_avx(auVar81,auVar72);
                  auVar69._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar61;
                  auVar69._16_16_ = ZEXT116(1) * auVar70;
                  if ((uVar29 < uVar32) && (lVar31 < (long)uVar27 && 2 < uVar25)) {
                    *(int *)(lVar51 + local_620 + uVar25 * 4) = auVar4._0_4_;
                  }
                  auVar9 = vpcmpgtq_avx2(auVar10,auVar84);
                  auVar13._8_8_ = uStack_178;
                  auVar13._0_8_ = local_180;
                  auVar13._16_8_ = uStack_170;
                  auVar13._24_8_ = uStack_168;
                  auVar86 = vpcmpgtq_avx2(auVar13,auVar10);
                  auVar86 = vpand_avx2(auVar86,local_140);
                  auVar86 = vpand_avx2(auVar86,auVar9);
                  auVar70 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
                  auVar93._0_8_ = -(ulong)(uVar52 == local_380._0_8_);
                  auVar93._8_8_ = -(ulong)(auVar82._8_8_ == local_380._8_8_);
                  auVar93._16_8_ = -(ulong)(uVar57 == local_380._16_8_);
                  auVar93._24_8_ = -(ulong)(auVar82._24_8_ == local_380._24_8_);
                  auVar99 = vpcmpgtq_avx2(auVar82,local_380);
                  auVar9 = vpand_avx2(auVar99,auVar86);
                  local_380 = vblendvpd_avx(local_380,auVar109,auVar9);
                  auVar61 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
                  auVar9 = vpcmpgtq_avx2(local_360,auVar10);
                  auVar9 = vpand_avx2(auVar9,auVar93);
                  auVar64 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
                  auVar70 = vblendvps_avx(auVar61,auVar70,auVar64);
                  auVar8 = vpmovsxdq_avx2(auVar70);
                  local_340 = vblendvpd_avx(local_340,auVar104,auVar8);
                  local_320 = vblendvpd_avx(local_320,auVar83,auVar8);
                  local_4a0 = vblendvpd_avx(auVar98._0_32_,auVar4,auVar8);
                  auVar98 = ZEXT3264(local_4a0);
                  local_4c0 = vblendvpd_avx(auVar94._0_32_,auVar7,auVar8);
                  auVar94 = ZEXT3264(local_4c0);
                  auVar4 = vpor_avx2(auVar9,auVar99);
                  auVar4 = vpand_avx2(auVar86,auVar4);
                  local_360 = vblendvpd_avx(local_360,auVar10,auVar4);
                  auVar8._8_8_ = lVar26;
                  auVar8._0_8_ = lVar26;
                  auVar8._16_8_ = lVar26;
                  auVar8._24_8_ = lVar26;
                  auVar4 = vblendvpd_avx(auVar69,auVar8,auVar62);
                  auVar104 = vandnpd_avx(auVar62,local_200);
                  auVar110 = ZEXT3264(auVar104);
                  ptr_01[uVar25] = uVar52;
                  ptr_02[uVar25] = uVar48;
                  ptr_03[uVar25] = uVar38;
                  ptr_04[uVar25] = uVar95;
                  auVar104 = vandnpd_avx(auVar62,local_400);
                  auVar115 = ZEXT3264(auVar104);
                  ptr_05[uVar25] = uVar44;
                  iVar1 = vmovlps_avx(local_4e0._0_16_);
                  ptr_06[uVar25] = iVar1;
                  local_5c0._0_8_ = auVar5._0_8_;
                  local_5c0._8_8_ = auVar5._8_8_;
                  local_5c0._16_8_ = auVar5._16_8_;
                  local_5c0._24_8_ = auVar5._24_8_;
                  ptr_07[uVar25] = local_5c0._0_8_;
                  iVar1 = vmovlps_avx(local_580._0_16_);
                  ptr_08[uVar25] = iVar1;
                  auVar5 = vandnpd_avx(auVar62,local_3a0);
                  auVar63 = ZEXT3264(auVar5);
                  auVar10 = vpsubq_avx2(auVar10,auVar84);
                  uVar25 = uVar25 + 1;
                  auVar5 = local_e0;
                } while (uVar33 != uVar25);
                auVar10._8_8_ = 4;
                auVar10._0_8_ = 4;
                auVar10._16_8_ = 4;
                auVar10._24_8_ = 4;
                auVar7 = vpaddq_avx2(auVar7,auVar10);
                uVar28 = uVar28 + 4;
                local_608 = local_608 + lVar18;
                local_600 = local_600 + lVar18;
                local_620 = local_620 + lVar18;
                local_628 = local_628 + lVar18;
                local_120 = auVar6;
              } while (uVar28 < uVar32);
            }
            local_300[0] = local_380._0_8_;
            local_300[1] = local_380._8_8_;
            local_300[2] = local_380._16_8_;
            local_300[3] = local_380._24_8_;
            local_3e0[0] = local_360._0_8_;
            local_3e0[1] = local_360._8_8_;
            local_3e0[2] = local_360._16_8_;
            local_3e0[3] = local_360._24_8_;
            local_460[0] = local_340._0_8_;
            local_460[1] = local_340._8_8_;
            local_460[2] = local_340._16_8_;
            local_460[3] = local_340._24_8_;
            local_480[0] = local_320._0_8_;
            local_480[1] = local_320._8_8_;
            local_480[2] = local_320._16_8_;
            local_480[3] = local_320._24_8_;
            lVar43 = 0;
            iVar36 = 0;
            iVar21 = 0;
            lVar18 = lVar26;
            lVar30 = lVar26;
            lVar31 = lVar26;
            lVar51 = lVar26;
            do {
              lVar3 = local_300[lVar43];
              if (lVar31 < lVar3) {
                lVar18 = local_460[lVar43];
                lVar30 = local_480[lVar43];
                lVar51 = local_480[lVar43 + -4];
                iVar36 = *(int *)(local_4c0 + lVar43 * 8);
                lVar31 = lVar3;
                iVar21 = (int)local_3e0[lVar43];
              }
              else if (lVar3 == lVar31) {
                lVar3 = local_3e0[lVar43];
                if (lVar3 < iVar21) {
                  lVar18 = local_460[lVar43];
                  lVar30 = local_480[lVar43];
                  lVar51 = local_480[lVar43 + -4];
                  iVar36 = *(int *)(local_4c0 + lVar43 * 8);
                  iVar21 = (int)lVar3;
                }
                else if ((lVar3 == iVar21) && (*(long *)(local_4c0 + lVar43 * 8) < (long)iVar36)) {
                  lVar18 = local_460[lVar43];
                  lVar30 = local_480[lVar43];
                  lVar51 = local_480[lVar43 + -4];
                  iVar36 = (int)*(long *)(local_4c0 + lVar43 * 8);
                  iVar21 = (int)lVar3;
                }
              }
              iVar49 = (int)lVar51;
              iVar23 = (int)lVar30;
              iVar16 = (int)lVar18;
              lVar43 = lVar43 + 1;
            } while ((int)lVar43 != 4);
            auVar6._8_8_ = lVar26;
            auVar6._0_8_ = lVar26;
            auVar6._16_8_ = lVar26;
            auVar6._24_8_ = lVar26;
            auVar7 = vpcmpgtq_avx2(auVar6,local_440);
            auVar12._8_8_ = lStack_3b8;
            auVar12._0_8_ = local_3c0;
            auVar12._16_8_ = lStack_3b0;
            auVar12._24_8_ = lStack_3a8;
            auVar6 = vpcmpgtq_avx2(local_420,auVar12);
            auVar7 = vpor_avx2(auVar6,auVar7);
            if ((((auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 SUB321(auVar7 >> 0x7f,0) != '\0') || SUB321(auVar7 >> 0xbf,0) != '\0') ||
                auVar7[0x1f] < '\0') {
              *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
              lVar31 = 0;
              iVar16 = 0;
              iVar23 = 0;
              iVar49 = 0;
              iVar21 = 0;
              iVar36 = 0;
            }
            ppVar17->score = (int)lVar31;
            ppVar17->end_query = iVar36;
            ppVar17->end_ref = iVar21;
            ((ppVar17->field_4).stats)->matches = iVar16;
            ((ppVar17->field_4).stats)->similar = iVar23;
            ((ppVar17->field_4).stats)->length = iVar49;
            parasail_free(ptr_08);
            parasail_free(ptr_07);
            parasail_free(ptr_06);
            parasail_free(ptr_05);
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            return ppVar17;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(32, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i case1 = vZero;
        __m256i case2 = vZero;
        __m256i case0 = vZero;
        __m256i vNH = vNegInf0;
        __m256i vNM = vZero;
        __m256i vNS = vZero;
        __m256i vNL = vZero;
        __m256i vWH = vNegInf0;
        __m256i vWM = vZero;
        __m256i vWS = vZero;
        __m256i vWL = vZero;
        __m256i vE = vNegInf;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vEM = vZero;
        __m256i vES = vZero;
        __m256i vEL = vZero;
        __m256i vF = vNegInf;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vFM = vZero;
        __m256i vFS = vZero;
        __m256i vFL = vZero;
        __m256i vJ = vJreset;
        __m256i vs1 = _mm256_set_epi64x_rpl(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m256i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            __m256i vNWM = vNM;
            __m256i vNWS = vNS;
            __m256i vNWL = vNL;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vNM = _mm256_srli_si256_rpl(vWM, 8);
            vNM = _mm256_insert_epi64_rpl(vNM, HM_pr[j], 3);
            vNS = _mm256_srli_si256_rpl(vWS, 8);
            vNS = _mm256_insert_epi64_rpl(vNS, HS_pr[j], 3);
            vNL = _mm256_srli_si256_rpl(vWL, 8);
            vNL = _mm256_insert_epi64_rpl(vNL, HL_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vFM = _mm256_srli_si256_rpl(vFM, 8);
            vFM = _mm256_insert_epi64_rpl(vFM, FM_pr[j], 3);
            vFS = _mm256_srli_si256_rpl(vFS, 8);
            vFS = _mm256_insert_epi64_rpl(vFS, FS_pr[j], 3);
            vFL = _mm256_srli_si256_rpl(vFL, 8);
            vFL = _mm256_insert_epi64_rpl(vFL, FL_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vNM, case1);
            vFS = _mm256_blendv_epi8(vFS, vNS, case1);
            vFL = _mm256_blendv_epi8(vFL, vNL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vWM, case1);
            vES = _mm256_blendv_epi8(vES, vWS, case1);
            vEL = _mm256_blendv_epi8(vEL, vWL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vs2 = _mm256_srli_si256_rpl(vs2, 8);
            vs2 = _mm256_insert_epi64_rpl(vs2, s2[j], 3);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            vWH = _mm256_max_epi64_rpl(vWH, vZero);
            case1 = _mm256_cmpeq_epi64(vWH, vNWH);
            case2 = _mm256_cmpeq_epi64(vWH, vF);
            case0 = _mm256_cmpeq_epi64(vWH, vZero);
            vWM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vNWM,
                        _mm256_and_si256(
                            _mm256_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm256_blendv_epi8(vWM, vZero, case0);
            vWS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vNWS,
                        _mm256_and_si256(
                            _mm256_cmpgt_epi64(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm256_blendv_epi8(vWS, vZero, case0);
            vWL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vNWL, vOne), case1);
            vWL = _mm256_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vWM = _mm256_andnot_si256(cond, vWM);
                vWS = _mm256_andnot_si256(cond, vWS);
                vWL = _mm256_andnot_si256(cond, vWL);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm256_andnot_si256(cond, vEM);
                vES = _mm256_andnot_si256(cond, vES);
                vEL = _mm256_andnot_si256(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            HM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWM,0);
            HS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWS,0);
            HL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWL,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            FM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFM,0);
            FS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFS,0);
            FL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *m = (int64_t*)&vMaxM;
        int64_t *s = (int64_t*)&vMaxS;
        int64_t *l = (int64_t*)&vMaxL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}